

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_resampler.cpp
# Opt level: O3

void __thiscall crnlib::Resampler::resample_x(Resampler *this,Sample *Pdst,Sample *Psrc)

{
  bool bVar1;
  int iVar2;
  Contrib_List *pCVar3;
  uint uVar4;
  unsigned_short *puVar5;
  Sample SVar6;
  
  if (0 < this->m_resample_dst_x) {
    pCVar3 = this->m_Pclist_x;
    iVar2 = this->m_resample_dst_x;
    do {
      if (pCVar3->n == 0) {
        SVar6 = 0.0;
      }
      else {
        puVar5 = &pCVar3->p->pixel;
        uVar4 = pCVar3->n + 1;
        SVar6 = 0.0;
        do {
          SVar6 = SVar6 + Psrc[*puVar5] * ((Contrib *)(puVar5 + -2))->weight;
          puVar5 = puVar5 + 4;
          uVar4 = uVar4 - 1;
        } while (1 < uVar4);
      }
      *Pdst = SVar6;
      Pdst = Pdst + 1;
      pCVar3 = pCVar3 + 1;
      bVar1 = 1 < iVar2;
      iVar2 = iVar2 + -1;
    } while (bVar1);
  }
  return;
}

Assistant:

void Resampler::resample_x(Sample* Pdst, const Sample* Psrc)
    {
        resampler_assert(Pdst);
        resampler_assert(Psrc);

        int i, j;
        Sample total;
        Contrib_List* Pclist = m_Pclist_x;
        Contrib* p;

        for (i = m_resample_dst_x; i > 0; i--, Pclist++)
        {
#if CRNLIB_RESAMPLER_DEBUG_OPS
            total_ops += Pclist->n;
#endif

            for (j = Pclist->n, p = Pclist->p, total = 0; j > 0; j--, p++)
            {
                total += Psrc[p->pixel] * p->weight;
            }

            *Pdst++ = total;
        }
    }